

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

bool __thiscall
llvm::
DenseMapIterator<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>,_false>
::operator!=(DenseMapIterator<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>,_false>
             *this,ConstIterator *RHS)

{
  bool bVar1;
  bool bVar2;
  void *pvVar3;
  void *pvVar4;
  ConstIterator *RHS_local;
  DenseMapIterator<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>,_false>
  *this_local;
  
  if (this->Ptr == (pointer)0x0) {
LAB_001b3985:
    bVar1 = true;
  }
  else {
    bVar2 = DebugEpochBase::HandleBase::isHandleInSync((HandleBase *)this);
    bVar1 = false;
    if (bVar2) goto LAB_001b3985;
  }
  if (!bVar1) {
    __assert_fail("(!Ptr || isHandleInSync()) && \"handle not in sync!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                  ,0x494,
                  "bool llvm::DenseMapIterator<llbuild::core::CancellationDelegate *, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>>::operator!=(const ConstIterator &) const [KeyT = llbuild::core::CancellationDelegate *, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, Bucket = llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>, IsConst = false]"
                 );
  }
  if (RHS->Ptr != (pointer)0x0) {
    bVar2 = DebugEpochBase::HandleBase::isHandleInSync((HandleBase *)RHS);
    bVar1 = false;
    if (!bVar2) goto LAB_001b39de;
  }
  bVar1 = true;
LAB_001b39de:
  if (!bVar1) {
    __assert_fail("(!RHS.Ptr || RHS.isHandleInSync()) && \"handle not in sync!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                  ,0x495,
                  "bool llvm::DenseMapIterator<llbuild::core::CancellationDelegate *, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>>::operator!=(const ConstIterator &) const [KeyT = llbuild::core::CancellationDelegate *, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, Bucket = llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>, IsConst = false]"
                 );
  }
  pvVar3 = DebugEpochBase::HandleBase::getEpochAddress((HandleBase *)this);
  pvVar4 = DebugEpochBase::HandleBase::getEpochAddress((HandleBase *)RHS);
  if (pvVar3 == pvVar4) {
    return this->Ptr != RHS->Ptr;
  }
  __assert_fail("getEpochAddress() == RHS.getEpochAddress() && \"comparing incomparable iterators!\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                ,0x497,
                "bool llvm::DenseMapIterator<llbuild::core::CancellationDelegate *, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>>::operator!=(const ConstIterator &) const [KeyT = llbuild::core::CancellationDelegate *, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, Bucket = llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>, IsConst = false]"
               );
}

Assistant:

bool operator!=(const ConstIterator &RHS) const {
    assert((!Ptr || isHandleInSync()) && "handle not in sync!");
    assert((!RHS.Ptr || RHS.isHandleInSync()) && "handle not in sync!");
    assert(getEpochAddress() == RHS.getEpochAddress() &&
           "comparing incomparable iterators!");
    return Ptr != RHS.Ptr;
  }